

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maropuparser.h
# Opt level: O2

int __thiscall
FastPForLib::MaropuGapReader::open(MaropuGapReader *this,char *__file,int __oflag,...)

{
  int iVar1;
  FILE *__stream;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *this_00;
  
  close(this,(int)__file);
  __stream = fopen((this->mFilename)._M_dataplus._M_p,"rb");
  this->fd = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    iVar1 = setvbuf(__stream,(char *)0x0,0,0x1000);
    return iVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"IO status: ");
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Can\'t open ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"could not open temp file");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void open() {
    close();
    fd = ::fopen(mFilename.c_str(), "rb");
    if (fd == NULL) {
      std::cerr << "IO status: " << strerror(errno) << std::endl;
      std::cerr << "Can't open " << mFilename << std::endl;
      throw std::runtime_error("could not open temp file");
    }
    setvbuf(fd, NULL, _IOFBF, 1024 * 4); // large buffer
  }